

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_outputBufferGetPythonFile(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 *puVar2;
  PyObject *pPVar3;
  PyObject *buffer;
  undefined *local_10;
  
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:outputBufferGetPythonFile",&local_10);
  if (iVar1 == 0) {
    return (PyObject *)0x0;
  }
  if (local_10 == &_Py_NoneStruct) {
    puVar2 = (undefined8 *)0x0;
  }
  else {
    puVar2 = *(undefined8 **)(local_10 + 0x10);
  }
  if (puVar2 == (undefined8 *)0x0) {
    libxml_outputBufferGetPythonFile_cold_2();
  }
  else if ((code *)puVar2[2] == xmlPythonFileClose) {
    pPVar3 = (PyObject *)*puVar2;
    if (pPVar3 != (PyObject *)0x0) goto LAB_0013d7e3;
  }
  else {
    libxml_outputBufferGetPythonFile_cold_1();
  }
  pPVar3 = (PyObject *)&_Py_NoneStruct;
LAB_0013d7e3:
  pPVar3->ob_refcnt = pPVar3->ob_refcnt + 1;
  return pPVar3;
}

Assistant:

static PyObject *
libxml_outputBufferGetPythonFile(ATTRIBUTE_UNUSED PyObject *self,
                                    PyObject *args) {
    PyObject *buffer;
    PyObject *file;
    xmlOutputBufferPtr obj;

    if (!PyArg_ParseTuple(args, (char *)"O:outputBufferGetPythonFile",
			  &buffer))
	return(NULL);

    obj = PyoutputBuffer_Get(buffer);
    if (obj == NULL) {
	fprintf(stderr,
	        "outputBufferGetPythonFile: obj == NULL\n");
	Py_INCREF(Py_None);
	return(Py_None);
    }
    if (obj->closecallback != xmlPythonFileClose) {
	fprintf(stderr,
	        "outputBufferGetPythonFile: not a python file wrapper\n");
	Py_INCREF(Py_None);
	return(Py_None);
    }
    file = (PyObject *) obj->context;
    if (file == NULL) {
	Py_INCREF(Py_None);
	return(Py_None);
    }
    Py_INCREF(file);
    return(file);
}